

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::permute<int>(Omega_h *this,Read<int> *a_data,LOs *a2b,Int width)

{
  int size_in;
  char *file;
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> local_160;
  Write<int> local_150;
  Read<int> local_140;
  Read<int> local_130;
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [8];
  Write<int> b_data;
  __cxx11 local_e0 [4];
  LO nb;
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [35];
  ScopedTimer local_45;
  Int local_44;
  ScopedTimer omega_h_scoped_function_timer;
  LOs *pLStack_40;
  Int width_local;
  LOs *a2b_local;
  Read<int> *a_data_local;
  ulong local_10;
  
  local_44 = width;
  pLStack_40 = a2b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_a9);
  std::operator+(local_88,(char *)local_a8);
  std::__cxx11::to_string(local_e0,0x84);
  std::operator+(local_68,local_88);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_45,"permute",file);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  b_data.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2);
  size_in = b_data.shared_alloc_.direct_ptr._4_4_ * local_44;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"",&local_119);
  Write<int>::Write((Write<int> *)local_f8,size_in,(string *)local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  Read<int>::Read(&local_130,a_data);
  Read<int>::Read(&local_140,a2b);
  Write<int>::Write(&local_150,(Write<int> *)local_f8);
  map_into<int>(&local_130,&local_140,&local_150,local_44);
  Write<int>::~Write(&local_150);
  Read<int>::~Read(&local_140);
  Read<int>::~Read(&local_130);
  Write<int>::Write(&local_160,(Write<int> *)local_f8);
  Read<int>::Read((Read<int> *)this,&local_160);
  Write<int>::~Write(&local_160);
  Write<int>::~Write((Write<int> *)local_f8);
  ScopedTimer::~ScopedTimer(&local_45);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> permute(Read<T> a_data, LOs a2b, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto nb = a2b.size();
  Write<T> b_data(nb * width);
  map_into(a_data, a2b, b_data, width);
  return b_data;
}